

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

void __thiscall leveldb::Harness::Init(Harness *this,TestArgs *args)

{
  TableConstructor *this_00;
  BlockConstructor *this_01;
  MemTableConstructor *this_02;
  DBConstructor *this_03;
  Options local_78;
  TestArgs *local_18;
  TestArgs *args_local;
  Harness *this_local;
  
  local_18 = args;
  args_local = (TestArgs *)this;
  if (this->constructor_ != (Constructor *)0x0) {
    (*this->constructor_->_vptr_Constructor[1])();
  }
  this->constructor_ = (Constructor *)0x0;
  Options::Options(&local_78);
  memcpy(this,&local_78,0x60);
  (this->options_).block_restart_interval = local_18->restart_interval;
  (this->options_).block_size = 0x100;
  if ((local_18->reverse_compare & 1U) != 0) {
    (this->options_).comparator = (Comparator *)&reverse_key_comparator;
  }
  switch(local_18->type) {
  case TABLE_TEST:
    this_00 = (TableConstructor *)operator_new(0x48);
    TableConstructor::TableConstructor(this_00,(this->options_).comparator);
    this->constructor_ = (Constructor *)this_00;
    break;
  case BLOCK_TEST:
    this_01 = (BlockConstructor *)operator_new(0x68);
    BlockConstructor::BlockConstructor(this_01,(this->options_).comparator);
    this->constructor_ = (Constructor *)this_01;
    break;
  case MEMTABLE_TEST:
    this_02 = (MemTableConstructor *)operator_new(0x50);
    MemTableConstructor::MemTableConstructor(this_02,(this->options_).comparator);
    this->constructor_ = (Constructor *)this_02;
    break;
  case DB_TEST:
    this_03 = (DBConstructor *)operator_new(0x48);
    DBConstructor::DBConstructor(this_03,(this->options_).comparator);
    this->constructor_ = (Constructor *)this_03;
  }
  return;
}

Assistant:

void Init(const TestArgs& args) {
    delete constructor_;
    constructor_ = nullptr;
    options_ = Options();

    options_.block_restart_interval = args.restart_interval;
    // Use shorter block size for tests to exercise block boundary
    // conditions more.
    options_.block_size = 256;
    if (args.reverse_compare) {
      options_.comparator = &reverse_key_comparator;
    }
    switch (args.type) {
      case TABLE_TEST:
        constructor_ = new TableConstructor(options_.comparator);
        break;
      case BLOCK_TEST:
        constructor_ = new BlockConstructor(options_.comparator);
        break;
      case MEMTABLE_TEST:
        constructor_ = new MemTableConstructor(options_.comparator);
        break;
      case DB_TEST:
        constructor_ = new DBConstructor(options_.comparator);
        break;
    }
  }